

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

int Cba_StrCmp(char **pp1,char **pp2)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  
  for (lVar4 = 0;
      ((cVar1 = (*pp1)[lVar4], cVar1 != '\0' && (cVar2 = (*pp2)[lVar4], cVar2 != '\0')) &&
      (cVar1 == cVar2)); lVar4 = lVar4 + 1) {
  }
  iVar3 = Cba_StrCmpInt(*pp1,*pp2,(int)lVar4);
  return iVar3;
}

Assistant:

int Cba_StrCmp( char ** pp1, char ** pp2 )
{
    char * p1 = *pp1;
    char * p2 = *pp2; int i;
    for ( i = 0; p1[i] && p2[i]; i++ )
        if ( p1[i] != p2[i] )
            return Cba_StrCmpInt( p1, p2, i );
    assert( !p1[i] || !p2[i] );
    return Cba_StrCmpInt( p1, p2, i );
}